

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O2

int greatest_prng_init_second_pass(int id,unsigned_long seed)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  unsigned_long uVar5;
  uint uVar6;
  undefined8 in_R9;
  
  lVar3 = (long)id;
  uVar1 = greatest_info.prng[lVar3].count;
  if (uVar1 == 0) {
    return 0;
  }
  greatest_info.prng[lVar3].count_ceil = uVar1;
  uVar2 = 1;
  do {
    uVar4 = uVar2;
    uVar2 = uVar4 * 2;
  } while (uVar4 < uVar1);
  greatest_info.prng[lVar3].m = uVar4;
  uVar6 = (uint)seed & 0x1fffffff;
  greatest_info.prng[lVar3].state = (ulong)uVar6;
  uVar5 = 5;
  if ((seed & 0x1fffffff) != 0) {
    uVar5 = (ulong)uVar6 * 4 + 1;
  }
  greatest_info.prng[lVar3].a = uVar5;
  greatest_info.prng[lVar3].c = 0x7fffffff;
  greatest_info.prng[lVar3].initialized = '\x01';
  fprintf(_stderr,"init_second_pass: a %lu, c %lu, state %lu\n",uVar5,0x7fffffff,(ulong)uVar6,in_R9,
          lVar3 * 0x40 + 0x109218);
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}